

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  byte bVar1;
  char *pcVar2;
  byte *in_RCX;
  byte *pbVar3;
  byte *extraout_RDX;
  byte *__buf;
  byte *extraout_RDX_00;
  uint uVar4;
  uint uVar5;
  
  pbVar3 = (byte *)LineContents.Length;
  __buf = pbVar3;
  if ((uint)LineContents.Length != 0) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (pbVar3 <= (byte *)(ulong)uVar5) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      bVar1 = LineContents.Data[(long)(ulong)uVar5];
      if (bVar1 == 9) {
        do {
          pcVar2 = S->OutBufCur;
          if (pcVar2 < S->OutBufEnd) {
            in_RCX = (byte *)(pcVar2 + 1);
            S->OutBufCur = (char *)in_RCX;
            *pcVar2 = ' ';
          }
          else {
            llvm::raw_ostream::write(S,0x20,__buf,(size_t)in_RCX);
            __buf = extraout_RDX;
          }
          uVar4 = uVar4 + 1;
        } while ((uVar4 & 7) != 0);
      }
      else {
        in_RCX = (byte *)S->OutBufCur;
        if (in_RCX < S->OutBufEnd) {
          __buf = in_RCX + 1;
          S->OutBufCur = (char *)__buf;
          *in_RCX = bVar1;
        }
        else {
          llvm::raw_ostream::write(S,(uint)bVar1,__buf,(size_t)in_RCX);
          __buf = extraout_RDX_00;
        }
        uVar4 = uVar4 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)LineContents.Length);
  }
  pcVar2 = S->OutBufCur;
  if (S->OutBufEnd <= pcVar2) {
    llvm::raw_ostream::write(S,10,__buf,(size_t)in_RCX);
    return;
  }
  S->OutBufCur = pcVar2 + 1;
  *pcVar2 = '\n';
  return;
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    if (LineContents[i] != '\t') {
      S << LineContents[i];
      ++OutCol;
      continue;
    }

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}